

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O2

bool __thiscall
cmParseJacocoCoverage::LoadCoverageData
          (cmParseJacocoCoverage *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmCTest *this_00;
  ostream *poVar1;
  long lVar2;
  bool bVar3;
  Directory dir;
  string path;
  char *local_1c8 [4];
  ostringstream cmCTestLog_msg;
  
  cmsys::Directory::Directory(&dir);
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  lVar2 = (long)(files->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(files->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    std::__cxx11::string::_M_assign((string *)&path);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar1 = std::operator<<((ostream *)&cmCTestLog_msg,"Reading XML File ");
    poVar1 = std::operator<<(poVar1,(string *)&path);
    std::endl<char,std::char_traits<char>>(poVar1);
    this_00 = this->CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(this_00,4,
                 "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CTest/cmParseJacocoCoverage.cxx"
                 ,0xa9,local_1c8[0],this->Coverage->Quiet);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    cmsys::SystemTools::GetFilenameLastExtension((string *)&cmCTestLog_msg,&path);
    bVar3 = std::operator==((string *)&cmCTestLog_msg,".xml");
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    if (bVar3) {
      ReadJacocoXML(this,path._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::~string((string *)&path);
  cmsys::Directory::~Directory(&dir);
  return true;
}

Assistant:

bool cmParseJacocoCoverage::LoadCoverageData(
  std::vector<std::string> const& files)
{
  // load all the jacoco.xml files in the source directory
  cmsys::Directory dir;
  size_t i;
  std::string path;
  size_t numf = files.size();
  for (i = 0; i < numf; i++) {
    path = files[i];

    cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                       "Reading XML File " << path << std::endl,
                       this->Coverage.Quiet);
    if (cmSystemTools::GetFilenameLastExtension(path) == ".xml") {
      if (!this->ReadJacocoXML(path.c_str())) {
        return false;
      }
    }
  }
  return true;
}